

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclLiberty.c
# Opt level: O2

int Scl_LibertyReadCellIsDontUse(Scl_Tree_t *p,Scl_Item_t *pCell)

{
  int iVar1;
  Scl_Item_t *pSVar2;
  int *piVar3;
  
  piVar3 = &pCell->Child;
  do {
    pSVar2 = Scl_LibertyItem(p,*piVar3);
    if (pSVar2 == (Scl_Item_t *)0x0) {
      return 0;
    }
    iVar1 = Scl_LibertyCompare(p,pSVar2->Key,"dont_use");
    piVar3 = &pSVar2->Next;
  } while (iVar1 != 0);
  return 1;
}

Assistant:

int Scl_LibertyReadCellIsDontUse( Scl_Tree_t * p, Scl_Item_t * pCell )
{
    Scl_Item_t * pAttr;
    Scl_ItemForEachChild( p, pCell, pAttr )
        if ( !Scl_LibertyCompare(p, pAttr->Key, "dont_use") )
            return 1;
    return 0;
}